

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O2

VarType * __thiscall
deqp::gls::RandomUniformBlockCase::generateType
          (VarType *__return_storage_ptr__,RandomUniformBlockCase *this,Random *rnd,int typeDepth,
          bool arrayOk)

{
  deRandom *rnd_00;
  uint uVar1;
  int iVar2;
  DataType basicType;
  uint uVar3;
  deUint32 dVar4;
  undefined7 in_register_00000081;
  undefined8 uVar5;
  long lVar6;
  char __rhs;
  bool bVar7;
  float fVar8;
  float fVar9;
  VarType elementType;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  deUint32 local_8c;
  StructType *local_88;
  deRandom *local_80;
  vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_> memberTypes;
  string local_50;
  
  uVar5 = CONCAT71(in_register_00000081,arrayOk);
  if ((typeDepth < this->m_maxStructDepth) && (fVar8 = deRandom_getFloat(&rnd->m_rnd), fVar8 < 0.1))
  {
    local_8c = this->m_features;
    memberTypes.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    memberTypes.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    memberTypes.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = &rnd->m_rnd;
    uVar1 = de::Random::getInt(rnd,1,this->m_maxStructMembers);
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    uVar1 = uVar3;
    while( true ) {
      iVar2 = (int)uVar5;
      bVar7 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      if (bVar7) break;
      uVar5 = 1;
      generateType(&elementType,this,(Random *)local_80,typeDepth + 1,true);
      std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::
      emplace_back<deqp::gls::ub::VarType>(&memberTypes,&elementType);
      ub::VarType::~VarType(&elementType);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"s",&local_b1);
    genName_abi_cxx11_(&local_50,(gls *)0x41,'Z',(char)this->m_structNdx,iVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elementType
                   ,&local_b0,&local_50);
    local_88 = ub::ShaderInterface::allocStruct
                         (&(this->super_UniformBlockCase).m_interface,(char *)elementType._0_8_);
    std::__cxx11::string::~string((string *)&elementType);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b0);
    this->m_structNdx = this->m_structNdx + 1;
    __rhs = 'A';
    for (lVar6 = 0; rnd_00 = local_80, (ulong)uVar3 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      dVar4 = 0;
      if ((local_8c >> 10 & 1) != 0) {
        fVar8 = deRandom_getFloat(local_80);
        fVar9 = deRandom_getFloat(rnd_00);
        dVar4 = (uint)(fVar9 < 0.15) << 0xb | (uint)(fVar8 < 0.15) << 10;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"m",(allocator<char> *)&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &elementType,&local_b0,__rhs);
      ub::StructType::addMember
                (local_88,(char *)elementType._0_8_,
                 (VarType *)
                 ((long)&(memberTypes.
                          super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar6),dVar4);
      std::__cxx11::string::~string((string *)&elementType);
      std::__cxx11::string::~string((string *)&local_b0);
      __rhs = __rhs + '\x01';
    }
    ub::VarType::VarType(__return_storage_ptr__,local_88);
    std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::~vector
              (&memberTypes);
    return __return_storage_ptr__;
  }
  if ((arrayOk && 0 < this->m_maxArrayLength) &&
     (fVar8 = deRandom_getFloat(&rnd->m_rnd), fVar8 < 0.1)) {
    dVar4 = this->m_features;
    iVar2 = de::Random::getInt(rnd,1,this->m_maxArrayLength);
    generateType(&elementType,this,rnd,typeDepth,SUB21((ushort)(short)dVar4 >> 0xf,0));
    ub::VarType::VarType(__return_storage_ptr__,&elementType,iVar2);
    ub::VarType::~VarType(&elementType);
    return __return_storage_ptr__;
  }
  elementType.m_data._8_8_ = 0;
  elementType.m_type = TYPE_BASIC;
  elementType.m_flags = 0;
  elementType.m_data.array.elementType = (VarType *)0x0;
  local_b0._M_dataplus._M_p._0_4_ = 1;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
             (DataType *)&local_b0);
  local_b0._M_dataplus._M_p._0_4_ = 0x1b;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
             (DataType *)&local_b0);
  local_b0._M_dataplus._M_p._0_4_ = 0x1f;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
             (DataType *)&local_b0);
  local_b0._M_dataplus._M_p._0_4_ = 0x23;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
             (DataType *)&local_b0);
  uVar3 = this->m_features;
  if ((uVar3 & 1) != 0) {
    local_b0._M_dataplus._M_p._0_4_ = 2;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 3;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 4;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x1c;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x1d;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x1e;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x20;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x21;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x22;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x24;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x25;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0x26;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    uVar3 = this->m_features;
  }
  if ((uVar3 & 2) != 0) {
    local_b0._M_dataplus._M_p._0_4_ = 5;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 6;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 8;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 9;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 10;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0xb;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0xc;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
    local_b0._M_dataplus._M_p._0_4_ = 0xd;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::emplace_back<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType,
               (DataType *)&local_b0);
  }
  basicType = de::Random::
              choose<glu::DataType,__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>>
                        (rnd,(__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                              )elementType._0_8_,elementType.m_data._0_8_);
  uVar3 = 0;
  if (3 < basicType - TYPE_BOOL) {
    uVar3 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (rnd,generateType::precisionCandidates,
                       (uint *)"N4deqp3gls22RandomUniformBlockCaseE");
  }
  ub::VarType::VarType(__return_storage_ptr__,basicType,uVar3);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&elementType);
  return __return_storage_ptr__;
}

Assistant:

VarType RandomUniformBlockCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk)
{
	const float structWeight	= 0.1f;
	const float arrayWeight		= 0.1f;

	if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		const float		unusedVtxWeight		= 0.15f;
		const float		unusedFragWeight	= 0.15f;
		bool			unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<VarType>	memberTypes;
		int				numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true));

		StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			deUint32 flags = 0;

			flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
			flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx], flags);
		}

		return VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const bool	arraysOfArraysOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const int	arrayLength			= rnd.getInt(1, m_maxArrayLength);
		VarType	elementType	= generateType(rnd, typeDepth, arraysOfArraysOk);
		return VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type	= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		deUint32		flags	= 0;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const deUint32 precisionCandidates[] = { PRECISION_LOW, PRECISION_MEDIUM, PRECISION_HIGH };
			flags |= rnd.choose<deUint32>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}

		return VarType(type, flags);
	}
}